

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationOperators_Test::TestBody
          (TimeUtilTest_DurationOperators_Test *this)

{
  Duration *pDVar1;
  bool bVar2;
  InternalMetadata IVar3;
  Duration *duration;
  Duration *duration_00;
  Duration *duration_01;
  Duration *duration_02;
  Duration *duration_03;
  Duration *duration_04;
  Duration *duration_05;
  Duration *duration_06;
  Duration *duration_07;
  Duration *duration_08;
  Duration *duration_09;
  Duration *duration_10;
  Duration *duration_11;
  Duration *duration_12;
  Duration *duration_13;
  Duration *duration_14;
  Duration *duration_15;
  Duration *duration_16;
  Duration *duration_17;
  Duration *duration_18;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Duration result_1;
  AssertionResult gtest_ar_2;
  Duration large;
  Duration large2;
  AssertionResult gtest_ar_24;
  Duration result_19;
  AssertionResult gtest_ar_25;
  Duration one_nano;
  Duration b;
  Duration one_second;
  Duration a;
  Duration result_16;
  undefined1 local_440 [8];
  InternalMetadata local_438;
  anon_union_24_1_493b367e_for_Duration_3 local_430;
  undefined1 local_418 [8];
  InternalMetadata local_410;
  anon_union_24_1_493b367e_for_Duration_3 local_408;
  undefined1 local_3f0 [8];
  InternalMetadata local_3e8;
  anon_union_24_1_493b367e_for_Duration_3 local_3e0;
  undefined1 local_3c8 [8];
  InternalMetadata local_3c0;
  anon_union_24_1_493b367e_for_Duration_3 local_3b8;
  undefined1 local_3a0 [8];
  InternalMetadata local_398;
  anon_union_24_1_493b367e_for_Duration_3 local_390;
  undefined1 local_378 [8];
  InternalMetadata local_370;
  anon_union_24_1_493b367e_for_Duration_3 local_368;
  internal local_350 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_348;
  Duration local_340;
  undefined1 local_318 [8];
  InternalMetadata local_310;
  anon_union_24_1_493b367e_for_Duration_3 local_308;
  Duration local_2f0;
  Duration local_2c8;
  Duration local_2a0;
  Duration local_278;
  Duration local_250;
  Duration local_228;
  Duration local_200;
  Duration local_1d8;
  Duration local_1b0;
  Duration local_188;
  Duration local_160;
  Duration local_138;
  Duration local_110;
  Duration local_e8;
  Duration local_c0;
  Duration local_98;
  Duration local_70;
  Duration local_48;
  
  TimeUtil::SecondsToDuration(&local_2f0,1);
  TimeUtil::NanosecondsToDuration(&local_340,1);
  Duration::Duration(&local_2c8,(Arena *)0x0,&local_2f0);
  operator+=(&local_2c8,&local_2f0);
  operator-=(&local_2c8,&local_340);
  TimeUtil::ToString_abi_cxx11_((string *)local_440,(TimeUtil *)&local_2c8,duration);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_318,"\"1.999999999s\"","TimeUtil::ToString(a)",
             (char (*) [13])0x1281fa4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
      &local_430) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_440._1_7_,local_440[0]),
                    CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
  }
  if (local_318[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_310.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310.ptr_
                );
  }
  Duration::Duration((Duration *)local_318,(Arena *)0x0);
  local_308._impl_.seconds_ = -local_2c8.field_0._impl_.seconds_;
  local_308._impl_.nanos_ = -local_2c8.field_0._impl_.nanos_;
  local_308._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_308._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  TimeUtil::ToString_abi_cxx11_((string *)local_440,(TimeUtil *)local_318,duration_00);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_3f0,"\"-1.999999999s\"","TimeUtil::ToString(b)",
             (char (*) [14])"-1.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
      &local_430) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_440._1_7_,local_440[0]),
                    CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
  }
  if (local_3f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3e8.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator+=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_01);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_418,"\"3.999999998s\"","TimeUtil::ToString(a + a)",
             (char (*) [13])0x128203e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator+=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_02);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_418,"\"0s\"","TimeUtil::ToString(a + b)",(char (*) [3])0x1281464,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator+=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_03);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_418,"\"0s\"","TimeUtil::ToString(b + a)",(char (*) [3])0x1281464,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0xff,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator+=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_04);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_418,"\"-3.999999998s\"","TimeUtil::ToString(b + b)",
             (char (*) [14])"-3.999999998s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x100,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator-=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_05);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_418,"\"3.999999998s\"","TimeUtil::ToString(a - b)",
             (char (*) [13])0x128203e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x101,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator-=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_06);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_418,"\"0s\"","TimeUtil::ToString(a - a)",(char (*) [3])0x1281464,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x102,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator-=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_07);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)local_418,"\"0s\"","TimeUtil::ToString(b - b)",(char (*) [3])0x1281464,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x103,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator-=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_08);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_418,"\"-3.999999998s\"","TimeUtil::ToString(b - a)",
             (char (*) [14])"-3.999999998s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x104,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator+=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::Duration(&local_48,(Arena *)0x0,&local_2c8);
  pDVar1 = operator*=(&local_48,2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3c8,"a + a","a * 2",(Duration *)local_3f0,(Duration *)local_440);
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_48);
  Duration::~Duration((Duration *)local_3f0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x107,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator+=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::Duration(&local_70,(Arena *)0x0,&local_2c8);
  pDVar1 = operator*=(&local_70,-2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3c8,"b + b","a * (-2)",(Duration *)local_3f0,(Duration *)local_440);
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_70);
  Duration::~Duration((Duration *)local_3f0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x108,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator+=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::Duration(&local_98,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator*=(&local_98,2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3c8,"b + b","b * 2",(Duration *)local_3f0,(Duration *)local_440);
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_98);
  Duration::~Duration((Duration *)local_3f0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x109,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator+=((Duration *)local_440,&local_2c8);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::Duration(&local_c0,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator*=(&local_c0,-2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3c8,"a + a","b * (-2)",(Duration *)local_3f0,(Duration *)local_440);
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_c0);
  Duration::~Duration((Duration *)local_3f0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration(&local_e8,(Arena *)0x0,&local_2c8);
  pDVar1 = operator*=(&local_e8,0.5);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3f0,(TimeUtil *)local_440,duration_09);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_3c8,"\"0.999999999s\"","TimeUtil::ToString(a * 0.5)",
             (char (*) [13])0x1282135,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3f0._1_7_,local_3f0[0]) !=
      &local_3e0) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3f0._1_7_,local_3f0[0]),local_3e0._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_e8);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration(&local_110,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator*=(&local_110,0.5);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3f0,(TimeUtil *)local_440,duration_10);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_3c8,"\"-0.999999999s\"","TimeUtil::ToString(b * 0.5)",
             (char (*) [14])"-0.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3f0._1_7_,local_3f0[0]) !=
      &local_3e0) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3f0._1_7_,local_3f0[0]),local_3e0._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_110);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x10c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2f0);
  pDVar1 = operator-=((Duration *)local_440,&local_340);
  Duration::Duration(&local_138,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  pDVar1 = operator*=(&local_138,0x4979cb9e00);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_11);
  testing::internal::CmpHelperEQ<char[18],std::__cxx11::string>
            ((internal *)local_418,"\"315575999684.424s\"",
             "TimeUtil::ToString((one_second - one_nano) * int64_t{315576000000})",
             (char (*) [18])0x12821f4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  Duration::~Duration(&local_138);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x110,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_340);
  pDVar1 = operator-=((Duration *)local_440,&local_2f0);
  Duration::Duration(&local_160,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  pDVar1 = operator*=(&local_160,0x4979cb9e00);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_12);
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            ((internal *)local_418,"\"-315575999684.424s\"",
             "TimeUtil::ToString((one_nano - one_second) * int64_t{315576000000})",
             (char (*) [19])"-315575999684.424s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  Duration::~Duration(&local_160);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x112,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2f0);
  pDVar1 = operator-=((Duration *)local_440,&local_340);
  Duration::Duration(&local_188,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  pDVar1 = operator*=(&local_188,-0x4979cb9e00);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_3f0,duration_13);
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            ((internal *)local_418,"\"-315575999684.424s\"",
             "TimeUtil::ToString((one_second - one_nano) * (int64_t{-315576000000}))",
             (char (*) [19])"-315575999684.424s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_3f0);
  Duration::~Duration(&local_188);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x114,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration(&local_1b0,(Arena *)0x0,&local_2c8);
  pDVar1 = operator/=(&local_1b0,2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3f0,(TimeUtil *)local_440,duration_14);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_3c8,"\"0.999999999s\"","TimeUtil::ToString(a / 2)",
             (char (*) [13])0x1282135,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3f0._1_7_,local_3f0[0]) !=
      &local_3e0) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3f0._1_7_,local_3f0[0]),local_3e0._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_1b0);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x117,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  Duration::Duration(&local_1d8,(Arena *)0x0,(Duration *)local_318);
  pDVar1 = operator/=(&local_1d8,2);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3f0,(TimeUtil *)local_440,duration_15);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_3c8,"\"-0.999999999s\"","TimeUtil::ToString(b / 2)",
             (char (*) [14])"-0.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3f0._1_7_,local_3f0[0]) !=
      &local_3e0) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3f0._1_7_,local_3f0[0]),local_3e0._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_1d8);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_3c0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x118,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0.ptr_
                );
  }
  TimeUtil::SecondsToDuration((Duration *)local_3c8,0x4979cb9e00);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3c8);
  pDVar1 = operator-=((Duration *)local_440,&local_340);
  Duration::Duration((Duration *)local_3f0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration((Duration *)local_3c8);
  Duration::Duration(&local_200,(Arena *)0x0,(Duration *)local_3f0);
  pDVar1 = operator/=(&local_200,0x4979cb9e00);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_440,duration_16);
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)local_418,"\"0.999999999s\"",
             "TimeUtil::ToString(large / int64_t{315576000000})",(char (*) [13])0x1282135,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_200);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x11c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration(&local_228,(Arena *)0x0);
  local_228.field_0._impl_.seconds_ = -local_3e0._impl_.seconds_;
  local_228.field_0._impl_.nanos_ = -local_3e0._impl_.nanos_;
  local_228.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_228.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  pDVar1 = operator/=(&local_228,0x4979cb9e00);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_440,duration_17);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_418,"\"-0.999999999s\"",
             "TimeUtil::ToString((-large) / int64_t{315576000000})",(char (*) [14])"-0.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_228);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x11e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration(&local_250,(Arena *)0x0,(Duration *)local_3f0);
  pDVar1 = operator/=(&local_250,-0x4979cb9e00);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,pDVar1);
  TimeUtil::ToString_abi_cxx11_((string *)local_3c8,(TimeUtil *)local_440,duration_18);
  testing::internal::CmpHelperEQ<char[14],std::__cxx11::string>
            ((internal *)local_418,"\"-0.999999999s\"",
             "TimeUtil::ToString(large / (int64_t{-315576000000}))",(char (*) [14])"-0.999999999s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_3c8._1_7_,local_3c8[0]) !=
      &local_3b8) {
    operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                    CONCAT71(local_3c8._1_7_,local_3c8[0]),local_3b8._0_8_ + 1);
  }
  Duration::~Duration((Duration *)local_440);
  Duration::~Duration(&local_250);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x120,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3c8,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3f0);
  pDVar1 = operator+=((Duration *)local_440,&local_340);
  Duration::Duration((Duration *)local_3c8,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3f0);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3c8);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3a0,"large","large % large2",(Duration *)local_3f0,
             (Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_398.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x122,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  Duration::Duration((Duration *)local_418,(Arena *)0x0);
  local_408._impl_.seconds_ = -local_3e0._impl_.seconds_;
  local_408._impl_.nanos_ = -local_3e0._impl_.nanos_;
  local_408._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_408._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_378,(Arena *)0x0);
  local_368._impl_.seconds_ = -local_3e0._impl_.seconds_;
  local_368._impl_.nanos_ = -local_3e0._impl_.nanos_;
  local_368._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_368._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_378);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3c8);
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            (local_350,"-large","(-large) % large2",(Duration *)local_418,(Duration *)local_3a0);
  Duration::~Duration((Duration *)local_3a0);
  Duration::~Duration((Duration *)local_378);
  Duration::~Duration((Duration *)local_418);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x123,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0);
  local_390._impl_.seconds_ = -local_3b8._impl_.seconds_;
  local_390._impl_.nanos_ = -local_3b8._impl_.nanos_;
  local_390._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_390._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3f0);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3a0);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_378,"large","large % (-large2)",(Duration *)local_3f0,
             (Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration((Duration *)local_3a0);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_370.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x124,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3c8);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3f0);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3a0,"one_nano","large2 % large",&local_340,(Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_398.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x125,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  Duration::Duration((Duration *)local_418,(Arena *)0x0);
  local_408._impl_.seconds_ = -local_340.field_0._impl_.seconds_;
  local_408._impl_.nanos_ = -local_340.field_0._impl_.nanos_;
  local_408._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_408._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_378,(Arena *)0x0);
  local_368._impl_.seconds_ = -local_3b8._impl_.seconds_;
  local_368._impl_.nanos_ = -local_3b8._impl_.nanos_;
  local_368._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_368._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_378);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3f0);
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            (local_350,"-one_nano","(-large2) % large",(Duration *)local_418,(Duration *)local_3a0);
  Duration::~Duration((Duration *)local_3a0);
  Duration::~Duration((Duration *)local_378);
  Duration::~Duration((Duration *)local_418);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x126,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0);
  local_390._impl_.seconds_ = -local_3e0._impl_.seconds_;
  local_390._impl_.nanos_ = -local_3e0._impl_.nanos_;
  local_390._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_390._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_440,(Arena *)0x0,(Duration *)local_3c8);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_3a0);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_378,"one_nano","large2 % (-large)",&local_340,(Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration((Duration *)local_3a0);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_370.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_
                );
  }
  TimeUtil::NanosecondsToDuration((Duration *)local_440,-5);
  if ((local_2c8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    local_2c8.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (local_2c8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  IVar3.ptr_ = local_438.ptr_;
  if ((local_438.ptr_ & 1U) != 0) {
    IVar3.ptr_ = *(undefined8 *)(local_438.ptr_ & 0xfffffffffffffffe);
  }
  if (local_2c8.super_Message.super_MessageLite._internal_metadata_.ptr_ == IVar3.ptr_) {
    Duration::InternalSwap(&local_2c8,(Duration *)local_440);
  }
  else {
    Duration::CopyFrom(&local_2c8,(Duration *)local_440);
  }
  Duration::~Duration((Duration *)local_440);
  TimeUtil::NanosecondsToDuration((Duration *)local_440,-2);
  Duration::Duration(&local_278,(Arena *)0x0,&local_2c8);
  pDVar1 = operator/=(&local_278,2);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3a0,"TimeUtil::NanosecondsToDuration(-2)","a / 2",
             (Duration *)local_440,(Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration(&local_278);
  Duration::~Duration((Duration *)local_440);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_398.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x12d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  TimeUtil::NanosecondsToDuration((Duration *)local_440,2);
  Duration::Duration(&local_2a0,(Arena *)0x0,&local_2c8);
  pDVar1 = operator/=(&local_2a0,-2);
  Duration::Duration((Duration *)local_418,(Arena *)0x0,pDVar1);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_3a0,"TimeUtil::NanosecondsToDuration(2)","a / (-2)",
             (Duration *)local_440,(Duration *)local_418);
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration(&local_2a0);
  Duration::~Duration((Duration *)local_440);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_398.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x12e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  TimeUtil::NanosecondsToDuration((Duration *)local_440,2);
  if ((local_310.ptr_ & 1U) != 0) {
    local_310.ptr_ = *(undefined8 *)(local_310.ptr_ & 0xfffffffffffffffe);
  }
  IVar3.ptr_ = local_438.ptr_;
  if ((local_438.ptr_ & 1U) != 0) {
    IVar3.ptr_ = *(undefined8 *)(local_438.ptr_ & 0xfffffffffffffffe);
  }
  if (local_310.ptr_ == IVar3.ptr_) {
    Duration::InternalSwap((Duration *)local_318,(Duration *)local_440);
  }
  else {
    Duration::CopyFrom((Duration *)local_318,(Duration *)local_440);
  }
  Duration::~Duration((Duration *)local_440);
  local_3a0._0_4_ = 0xfffffffe;
  local_418 = (undefined1  [8])operator/(&local_2c8,(Duration *)local_318);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_440,"-2","a / b",(int *)local_3a0,(long *)local_418);
  if (local_440[0] == (TimeUtil)0x0) {
    testing::Message::Message((Message *)local_418);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_438.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x130,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if (local_418 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_438,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438.ptr_
                );
  }
  TimeUtil::NanosecondsToDuration((Duration *)local_418,-1);
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_318);
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            ((internal *)local_378,"TimeUtil::NanosecondsToDuration(-1)","a % b",
             (Duration *)local_418,(Duration *)local_3a0);
  Duration::~Duration((Duration *)local_3a0);
  Duration::~Duration((Duration *)local_418);
  if (local_378[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_370.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x131,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_370,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370.ptr_
                );
  }
  local_378._0_4_ = 2;
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_308._impl_.seconds_;
  local_430._impl_.nanos_ = -local_308._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  local_3a0 = (undefined1  [8])operator/(&local_2c8,(Duration *)local_440);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_418,"2","a / (-b)",(int *)local_378,(long *)local_3a0);
  Duration::~Duration((Duration *)local_440);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = *(char **)local_410.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x132,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  TimeUtil::NanosecondsToDuration((Duration *)local_418,-1);
  Duration::Duration((Duration *)local_378,(Arena *)0x0);
  local_368._impl_.seconds_ = -local_308._impl_.seconds_;
  local_368._impl_.nanos_ = -local_308._impl_.nanos_;
  local_368._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_368._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_440,(Arena *)0x0,&local_2c8);
  pDVar1 = operator%=((Duration *)local_440,(Duration *)local_378);
  Duration::Duration((Duration *)local_3a0,(Arena *)0x0,pDVar1);
  Duration::~Duration((Duration *)local_440);
  testing::internal::CmpHelperEQ<google::protobuf::Duration,google::protobuf::Duration>
            (local_350,"TimeUtil::NanosecondsToDuration(-1)","a % (-b)",(Duration *)local_418,
             (Duration *)local_3a0);
  Duration::~Duration((Duration *)local_3a0);
  Duration::~Duration((Duration *)local_378);
  Duration::~Duration((Duration *)local_418);
  if (local_350[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_440);
    if (local_348 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_348->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x133,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_418,(Message *)local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_418);
    if ((long *)CONCAT71(local_440._1_7_,local_440[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_440._1_7_,local_440[0]) + 8))();
    }
  }
  if (local_348 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,local_348);
  }
  bVar2 = local_340.field_0._impl_.seconds_ < local_2f0.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ < local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano < one_second",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x136,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ <= local_2f0.field_0._impl_.seconds_;
  if (local_2f0.field_0._impl_.seconds_ == local_340.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ <= local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_second < one_nano",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x138,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_340.field_0._impl_.seconds_;
  local_430._impl_.nanos_ = -local_340.field_0._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_418,(Arena *)0x0);
  local_408._impl_.seconds_ = -local_2f0.field_0._impl_.seconds_;
  local_408._impl_.nanos_ = -local_2f0.field_0._impl_.nanos_;
  local_408._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_408._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  bVar2 = local_408._impl_.seconds_ <= local_430._impl_.seconds_;
  if (local_430._impl_.seconds_ == local_408._impl_.seconds_) {
    bVar2 = SBORROW4(local_430._impl_.nanos_,local_408._impl_.nanos_) ==
            local_430._impl_.nanos_ + local_2f0.field_0._impl_.nanos_ < 0;
  }
  local_3a0[0] = (internal)bVar2;
  local_398.ptr_ = 0;
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration((Duration *)local_440);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_3a0,
               (AssertionResult *)"-one_nano < -one_second","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x139,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_418 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_2f0.field_0._impl_.seconds_;
  local_430._impl_.nanos_ = -local_2f0.field_0._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_418,(Arena *)0x0);
  local_408._impl_.seconds_ = -local_2f0.field_0._impl_.seconds_;
  local_408._impl_.nanos_ = -local_2f0.field_0._impl_.nanos_;
  local_408._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_408._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  bVar2 = local_408._impl_.seconds_ <= local_430._impl_.seconds_;
  if (local_430._impl_.seconds_ == local_408._impl_.seconds_) {
    bVar2 = SBORROW4(local_430._impl_.nanos_,local_408._impl_.nanos_) ==
            local_430._impl_.nanos_ + local_2f0.field_0._impl_.nanos_ < 0;
  }
  local_3a0[0] = (internal)bVar2;
  local_398.ptr_ = 0;
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration((Duration *)local_440);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_3a0,
               (AssertionResult *)"-one_second < -one_second","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13a,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_418 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_2f0.field_0._impl_.seconds_;
  local_430._impl_.nanos_ = -local_2f0.field_0._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  Duration::Duration((Duration *)local_418,(Arena *)0x0);
  local_408._impl_.seconds_ = -local_340.field_0._impl_.seconds_;
  local_408._impl_.nanos_ = -local_340.field_0._impl_.nanos_;
  local_408._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_408._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  bVar2 = local_430._impl_.seconds_ < local_408._impl_.seconds_;
  if (local_430._impl_.seconds_ == local_408._impl_.seconds_) {
    bVar2 = SBORROW4(local_430._impl_.nanos_,local_408._impl_.nanos_) !=
            local_430._impl_.nanos_ + local_340.field_0._impl_.nanos_ < 0;
  }
  local_3a0[0] = (internal)bVar2;
  local_398.ptr_ = 0;
  Duration::~Duration((Duration *)local_418);
  Duration::~Duration((Duration *)local_440);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_3a0,
               (AssertionResult *)"-one_second < -one_nano","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13b,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_418 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_418 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_340.field_0._impl_.seconds_;
  local_430._impl_.nanos_ = -local_340.field_0._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  bVar2 = 0 < local_340.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == 0) {
    bVar2 = 0 < local_340.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  Duration::~Duration((Duration *)local_440);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"-one_nano < one_nano",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13c,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::Duration((Duration *)local_440,(Arena *)0x0);
  local_430._impl_.seconds_ = -local_340.field_0._impl_.seconds_;
  local_430._impl_.nanos_ = -local_340.field_0._impl_.nanos_;
  local_430._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_430._impl_._has_bits_.has_bits_[0]._0_1_ | 3;
  bVar2 = -1 < local_340.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == 0) {
    bVar2 = -1 < local_340.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  Duration::~Duration((Duration *)local_440);
  if (local_418[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano < -one_nano",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13d,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ <= local_2f0.field_0._impl_.seconds_;
  if (local_2f0.field_0._impl_.seconds_ == local_340.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ <= local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano > one_second",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x13f,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ < local_2f0.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ < local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_second > one_nano",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x141,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ < local_2f0.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ < local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano >= one_second"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x143,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ <= local_2f0.field_0._impl_.seconds_;
  if (local_2f0.field_0._impl_.seconds_ == local_340.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ <= local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_second >= one_nano"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x145,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ <= local_2f0.field_0._impl_.seconds_;
  if (local_2f0.field_0._impl_.seconds_ == local_340.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ <= local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano <= one_second"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x147,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  bVar2 = local_340.field_0._impl_.seconds_ < local_2f0.field_0._impl_.seconds_;
  if (local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    bVar2 = local_340.field_0._impl_.nanos_ < local_2f0.field_0._impl_.nanos_;
  }
  local_418[0] = (internal)bVar2;
  local_410.ptr_ = 0;
  if (bVar2 == false) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_second <= one_nano"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x149,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  local_418[0] = (internal)
                 (local_340.field_0._impl_.nanos_ != local_2f0.field_0._impl_.nanos_ ||
                 local_340.field_0._impl_.seconds_ != local_2f0.field_0._impl_.seconds_);
  local_410.ptr_ = 0;
  if (local_340.field_0._impl_.nanos_ == local_2f0.field_0._impl_.nanos_ &&
      local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano == one_second"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14c,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  local_418[0] = (internal)
                 (local_340.field_0._impl_.nanos_ != local_2f0.field_0._impl_.nanos_ ||
                 local_340.field_0._impl_.seconds_ != local_2f0.field_0._impl_.seconds_);
  local_410.ptr_ = 0;
  if (local_340.field_0._impl_.nanos_ == local_2f0.field_0._impl_.nanos_ &&
      local_340.field_0._impl_.seconds_ == local_2f0.field_0._impl_.seconds_) {
    testing::Message::Message((Message *)local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_440,(internal *)local_418,(AssertionResult *)"one_nano != one_second"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x14f,(char *)CONCAT71(local_440._1_7_,local_440[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
    if ((anon_union_24_1_493b367e_for_Duration_3 *)CONCAT71(local_440._1_7_,local_440[0]) !=
        &local_430) {
      operator_delete((anon_union_24_1_493b367e_for_Duration_3 *)
                      CONCAT71(local_440._1_7_,local_440[0]),
                      CONCAT71(local_430._1_7_,local_430._impl_._has_bits_.has_bits_[0]._0_1_) + 1);
    }
    if (local_3a0 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_3a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410.ptr_
                );
  }
  Duration::~Duration((Duration *)local_3c8);
  Duration::~Duration((Duration *)local_3f0);
  Duration::~Duration((Duration *)local_318);
  Duration::~Duration(&local_2c8);
  Duration::~Duration(&local_340);
  Duration::~Duration(&local_2f0);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationOperators) {
  Duration one_second = TimeUtil::SecondsToDuration(1);
  Duration one_nano = TimeUtil::NanosecondsToDuration(1);

  // Test +/-
  Duration a = one_second;
  a += one_second;
  a -= one_nano;
  EXPECT_EQ("1.999999999s", TimeUtil::ToString(a));
  Duration b = -a;
  EXPECT_EQ("-1.999999999s", TimeUtil::ToString(b));
  EXPECT_EQ("3.999999998s", TimeUtil::ToString(a + a));
  EXPECT_EQ("0s", TimeUtil::ToString(a + b));
  EXPECT_EQ("0s", TimeUtil::ToString(b + a));
  EXPECT_EQ("-3.999999998s", TimeUtil::ToString(b + b));
  EXPECT_EQ("3.999999998s", TimeUtil::ToString(a - b));
  EXPECT_EQ("0s", TimeUtil::ToString(a - a));
  EXPECT_EQ("0s", TimeUtil::ToString(b - b));
  EXPECT_EQ("-3.999999998s", TimeUtil::ToString(b - a));

  // Test *
  EXPECT_EQ(a + a, a * 2);
  EXPECT_EQ(b + b, a * (-2));
  EXPECT_EQ(b + b, b * 2);
  EXPECT_EQ(a + a, b * (-2));
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(a * 0.5));
  EXPECT_EQ("-0.999999999s", TimeUtil::ToString(b * 0.5));
  // Multiplication should not overflow if the result fits into the supported
  // range of Duration (intermediate result may be larger than int64).
  EXPECT_EQ("315575999684.424s", TimeUtil::ToString((one_second - one_nano) *
                                                    int64_t{315576000000}));
  EXPECT_EQ("-315575999684.424s", TimeUtil::ToString((one_nano - one_second) *
                                                     int64_t{315576000000}));
  EXPECT_EQ("-315575999684.424s", TimeUtil::ToString((one_second - one_nano) *
                                                     (int64_t{-315576000000})));

  // Test / and %
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(a / 2));
  EXPECT_EQ("-0.999999999s", TimeUtil::ToString(b / 2));
  Duration large =
      TimeUtil::SecondsToDuration(int64_t{315576000000}) - one_nano;
  // We have to handle division with values beyond 64 bits.
  EXPECT_EQ("0.999999999s", TimeUtil::ToString(large / int64_t{315576000000}));
  EXPECT_EQ("-0.999999999s",
            TimeUtil::ToString((-large) / int64_t{315576000000}));
  EXPECT_EQ("-0.999999999s",
            TimeUtil::ToString(large / (int64_t{-315576000000})));
  Duration large2 = large + one_nano;
  EXPECT_EQ(large, large % large2);
  EXPECT_EQ(-large, (-large) % large2);
  EXPECT_EQ(large, large % (-large2));
  EXPECT_EQ(one_nano, large2 % large);
  EXPECT_EQ(-one_nano, (-large2) % large);
  EXPECT_EQ(one_nano, large2 % (-large));
  // Some corner cases about negative values.
  //
  // (-5) / 2 = -2, remainder = -1
  // (-5) / (-2) = 2, remainder = -1
  a = TimeUtil::NanosecondsToDuration(-5);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-2), a / 2);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(2), a / (-2));
  b = TimeUtil::NanosecondsToDuration(2);
  EXPECT_EQ(-2, a / b);
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-1), a % b);
  EXPECT_EQ(2, a / (-b));
  EXPECT_EQ(TimeUtil::NanosecondsToDuration(-1), a % (-b));

  // Test relational operators.
  EXPECT_TRUE(one_nano < one_second);
  EXPECT_FALSE(one_second < one_second);
  EXPECT_FALSE(one_second < one_nano);
  EXPECT_FALSE(-one_nano < -one_second);
  EXPECT_FALSE(-one_second < -one_second);
  EXPECT_TRUE(-one_second < -one_nano);
  EXPECT_TRUE(-one_nano < one_nano);
  EXPECT_FALSE(one_nano < -one_nano);

  EXPECT_FALSE(one_nano > one_second);
  EXPECT_FALSE(one_nano > one_nano);
  EXPECT_TRUE(one_second > one_nano);

  EXPECT_FALSE(one_nano >= one_second);
  EXPECT_TRUE(one_nano >= one_nano);
  EXPECT_TRUE(one_second >= one_nano);

  EXPECT_TRUE(one_nano <= one_second);
  EXPECT_TRUE(one_nano <= one_nano);
  EXPECT_FALSE(one_second <= one_nano);

  EXPECT_TRUE(one_nano == one_nano);
  EXPECT_FALSE(one_nano == one_second);

  EXPECT_FALSE(one_nano != one_nano);
  EXPECT_TRUE(one_nano != one_second);
}